

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo1.cpp
# Opt level: O1

int64_t primecount::pi_lmo1(int64_t x)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  int64_t iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong a;
  ulong uVar8;
  ulong x_00;
  long res;
  ulong uVar9;
  double dVar10;
  type primes;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  long local_98;
  Vector<int,_std::allocator<int>_> local_90;
  Vector<int,_std::allocator<int>_> local_78;
  Vector<int,_std::allocator<int>_> local_60;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  if (x < 2) {
    iVar4 = 0;
  }
  else {
    dVar10 = cbrt((double)x);
    uVar9 = (ulong)dVar10;
    if (0 < (long)uVar9) {
      do {
        if (uVar9 * uVar9 - (ulong)x / uVar9 == 0 ||
            (long)(uVar9 * uVar9) < (long)((ulong)x / uVar9)) goto LAB_00119dde;
        bVar2 = 1 < (long)uVar9;
        uVar9 = uVar9 - 1;
      } while (bVar2);
      uVar9 = 0;
    }
LAB_00119dde:
    uVar9 = uVar9 - 1;
    do {
      uVar8 = uVar9;
      lVar7 = uVar8 + 2;
      uVar9 = uVar8 + 1;
    } while (lVar7 * lVar7 - x / lVar7 == 0 || lVar7 * lVar7 < x / lVar7);
    x_00 = 8;
    if (uVar9 < 0x14) {
      x_00 = (ulong)(byte)(&DAT_0015223d)[uVar8];
    }
    generate_primes_i32(&local_90,uVar9);
    generate_lpf(&local_60,uVar9);
    generate_moebius(&local_78,uVar9);
    lVar7 = (long)local_90.end_ - (long)local_90.array_;
    bVar2 = is_print();
    a = (lVar7 >> 2) - 1;
    uVar8 = (ulong)bVar2;
    local_48 = P2(x,uVar9,a,1,bVar2);
    if ((long)uVar9 < 1) {
      local_98 = 0;
    }
    else {
      local_98 = 0;
      uVar3 = 0;
      do {
        uVar5 = uVar3 + 1;
        if (local_90.array_[x_00] < local_60.array_[uVar3 + 1]) {
          iVar1 = local_78.array_[uVar3 + 1];
          iVar4 = phi((primecount *)((ulong)x / uVar5),x_00,1,0,SUB81(uVar8,0));
          local_98 = local_98 + iVar4 * iVar1;
        }
        uVar3 = uVar5;
      } while (uVar9 != uVar5);
    }
    if ((long)(x_00 + 1) < (long)a) {
      lVar7 = 0;
      uVar3 = x_00 + 1;
      local_40 = a;
      local_38 = x;
      do {
        uVar5 = uVar3;
        lVar6 = (long)uVar9 / (long)local_90.array_[uVar5];
        a = local_40;
        while (local_40 = a, lVar6 < (long)uVar9) {
          lVar6 = lVar6 + 1;
          if (local_90.array_[uVar5] < local_60.array_[lVar6]) {
            iVar1 = local_78.array_[lVar6];
            iVar4 = phi((primecount *)(local_38 / (local_90.array_[uVar5] * lVar6)),x_00,1,0,
                        SUB81(uVar8,0));
            lVar7 = lVar7 - iVar4 * iVar1;
            a = local_40;
          }
        }
        uVar3 = uVar5 + 1;
        x_00 = uVar5;
      } while (uVar5 + 1 != a);
    }
    else {
      lVar7 = 0;
    }
    iVar4 = a + ~local_48 + local_98 + lVar7;
    operator_delete(local_78.array_,(long)local_78.capacity_ - (long)local_78.array_);
    operator_delete(local_60.array_,(long)local_60.capacity_ - (long)local_60.array_);
    operator_delete(local_90.array_,(long)local_90.capacity_ - (long)local_90.array_);
  }
  return iVar4;
}

Assistant:

int64_t pi_lmo1(int64_t x)
{
  if (x < 2)
    return 0;

  int threads = 1;
  int64_t y = iroot<3>(x);
  int64_t c = PhiTiny::get_c(y);
  int64_t s1 = 0;
  int64_t s2 = 0;

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);
  bool is_print = false;

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);

  // ordinary leaves
  for (int64_t n = 1; n <= y; n++)
    if (lpf[n] > primes[c])
      s1 += mu[n] * phi(x / n, c, threads, is_print);

  // special leaves
  for (int64_t b = c + 1; b < pi_y; b++)
    for (int64_t m = (y / primes[b]) + 1; m <= y; m++)
      if (lpf[m] > primes[b])
        s2 -= mu[m] * phi(x / (primes[b] * m), b - 1, threads, is_print);

  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}